

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O2

void PrintBlock(InstructionRegVmLowerGraphContext *ctx,RegVmLoweredModule *lowModule,
               RegVmLoweredBlock *lowblock)

{
  VmBlock *pVVar1;
  char *pcVar2;
  OutputContext *pOVar3;
  RegVmLoweredInstruction *lowInstruction;
  byte *pbVar4;
  ulong uVar5;
  uint i;
  uint uVar6;
  RegVmLoweredInstruction **ppRVar7;
  
  pVVar1 = lowblock->vmBlock;
  pcVar2 = (pVVar1->name).begin;
  PrintLine(ctx->output,"%.*s.b%d:",(ulong)(uint)(*(int *)&(pVVar1->name).end - (int)pcVar2),pcVar2,
            (ulong)pVVar1->uniqueId);
  if ((lowblock->entryRegisters).count != 0) {
    Print(ctx->output,"  // entry registers: [");
    for (uVar6 = 0; uVar6 < (lowblock->entryRegisters).count; uVar6 = uVar6 + 1) {
      if (uVar6 != 0) {
        Print(ctx->output,", ");
      }
      pOVar3 = ctx->output;
      pbVar4 = SmallArray<unsigned_char,_16U>::operator[](&lowblock->entryRegisters,uVar6);
      Print(pOVar3,"r%d",(ulong)*pbVar4);
    }
    PrintLine(ctx->output,"]");
  }
  if ((lowblock->reservedRegisters).count != 0) {
    Print(ctx->output,"  // reserved registers: [");
    for (uVar6 = 0; uVar6 < (lowblock->reservedRegisters).count; uVar6 = uVar6 + 1) {
      if (uVar6 != 0) {
        Print(ctx->output,", ");
      }
      pOVar3 = ctx->output;
      pbVar4 = SmallArray<unsigned_char,_16U>::operator[](&lowblock->reservedRegisters,uVar6);
      Print(pOVar3,"r%d",(ulong)*pbVar4);
    }
    PrintLine(ctx->output,"]");
  }
  ppRVar7 = &lowblock->firstInstruction;
  while (lowInstruction = *ppRVar7, lowInstruction != (RegVmLoweredInstruction *)0x0) {
    PrintIndent(ctx->output);
    PrintInstruction(ctx,(char *)(lowModule->constants).data,lowInstruction);
    ppRVar7 = &lowInstruction->nextSibling;
  }
  if ((lowblock->exitRegisters).count != 0) {
    Print(ctx->output,"  // exit registers: [");
    for (uVar6 = 0; uVar6 < (lowblock->exitRegisters).count; uVar6 = uVar6 + 1) {
      if (uVar6 != 0) {
        Print(ctx->output,", ");
      }
      pOVar3 = ctx->output;
      pbVar4 = SmallArray<unsigned_char,_16U>::operator[](&lowblock->exitRegisters,uVar6);
      Print(pOVar3,"r%d",(ulong)*pbVar4);
    }
    PrintLine(ctx->output,"]");
  }
  if ((lowblock->lastInstruction != (RegVmLoweredInstruction *)0x0) &&
     ((uVar5 = (ulong)lowblock->lastInstruction->code, 0x22 < uVar5 ||
      ((0x4e0000000U >> (uVar5 & 0x3f) & 1) == 0)))) {
    PrintLine(ctx->output,"  // fallthrough");
  }
  PrintLine(ctx->output);
  return;
}

Assistant:

void PrintBlock(InstructionRegVmLowerGraphContext &ctx, RegVmLoweredModule *lowModule, RegVmLoweredBlock *lowblock)
{
	PrintLine(ctx.output, "%.*s.b%d:", FMT_ISTR(lowblock->vmBlock->name), lowblock->vmBlock->uniqueId);

	if(!lowblock->entryRegisters.empty())
	{
		Print(ctx.output, "  // entry registers: [");

		for(unsigned i = 0; i < lowblock->entryRegisters.size(); i++)
		{
			if(i != 0)
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d", lowblock->entryRegisters[i]);
		}

		PrintLine(ctx.output, "]");
	}

	if(!lowblock->reservedRegisters.empty())
	{
		Print(ctx.output, "  // reserved registers: [");

		for(unsigned i = 0; i < lowblock->reservedRegisters.size(); i++)
		{
			if(i != 0)
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d", lowblock->reservedRegisters[i]);
		}

		PrintLine(ctx.output, "]");
	}

	for(RegVmLoweredInstruction *lowInstruction = lowblock->firstInstruction; lowInstruction; lowInstruction = lowInstruction->nextSibling)
	{
		PrintIndent(ctx.output);
		PrintInstruction(ctx, (char*)lowModule->constants.data, lowInstruction);
	}

	if(!lowblock->exitRegisters.empty())
	{
		Print(ctx.output, "  // exit registers: [");

		for(unsigned i = 0; i < lowblock->exitRegisters.size(); i++)
		{
			if(i != 0)
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d", lowblock->exitRegisters[i]);
		}

		PrintLine(ctx.output, "]");
	}

	if(lowblock->lastInstruction && !IsBlockTerminator(lowblock->lastInstruction))
		PrintLine(ctx.output, "  // fallthrough");

	PrintLine(ctx.output);
}